

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_page.cpp
# Opt level: O0

void __thiscall http::Page::SendASCIIString(Page *this,char *string)

{
  char local_1c [4];
  char *pcStack_18;
  char buffer [4];
  char *string_local;
  Page *this_local;
  
  for (pcStack_18 = string; *pcStack_18 != '\0'; pcStack_18 = pcStack_18 + 1) {
    if ((*pcStack_18 < '!') || ('~' < *pcStack_18)) {
      snprintf(local_1c,4,"%%%02X",(ulong)(uint)(int)*pcStack_18);
      RawSend(this,local_1c,3);
    }
    else {
      RawSend(this,pcStack_18,1);
    }
  }
  return;
}

Assistant:

void http::Page::SendASCIIString(const char* string)
{
    char buffer[4];

    while (*string)
    {
        if (*string < 0x21 || *string > 0x7E)
        {
            snprintf(buffer, sizeof(buffer), "%%%02X", *string);
            RawSend(buffer, 3);
        }
        else
        {
            RawSend(string, 1);
        }
        string++;
    }
}